

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::MergingIterator::Next(MergingIterator *this)

{
  IteratorWrapper *this_00;
  undefined4 *puVar1;
  IteratorWrapper *pIVar2;
  Comparator *pCVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  long lVar6;
  Slice local_50;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  if (this->direction_ != kForward) {
    if (0 < this->n_) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        pIVar2 = this->children_;
        this_00 = (IteratorWrapper *)((long)&pIVar2->iter_ + lVar5);
        if (this_00 != this->current_) {
          iVar4 = (*(this->super_Iterator)._vptr_Iterator[8])(this);
          local_50.data_ = (char *)CONCAT44(extraout_var,iVar4);
          IteratorWrapper::Seek(this_00,&local_50);
          if ((&pIVar2->valid_)[lVar5] == true) {
            pCVar3 = this->comparator_;
            iVar4 = (*(this->super_Iterator)._vptr_Iterator[8])(this);
            local_50.data_ = (char *)CONCAT44(extraout_var_00,iVar4);
            puVar1 = (undefined4 *)((long)&(pIVar2->key_).data_ + lVar5);
            local_40 = *puVar1;
            uStack_3c = puVar1[1];
            uStack_38 = puVar1[2];
            uStack_34 = puVar1[3];
            iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_50,&local_40);
            if (iVar4 == 0) {
              IteratorWrapper::Next(this_00);
            }
          }
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x20;
      } while (lVar6 < this->n_);
    }
    this->direction_ = kForward;
  }
  IteratorWrapper::Next(this->current_);
  FindSmallest(this);
  return;
}

Assistant:

void Next() override {
    assert(Valid());

    // Ensure that all children are positioned after key().
    // If we are moving in the forward direction, it is already
    // true for all of the non-current_ children since current_ is
    // the smallest child and key() == current_->key().  Otherwise,
    // we explicitly position the non-current_ children.
    if (direction_ != kForward) {
      for (int i = 0; i < n_; i++) {
        IteratorWrapper* child = &children_[i];
        if (child != current_) {
          child->Seek(key());
          if (child->Valid() &&
              comparator_->Compare(key(), child->key()) == 0) {
            child->Next();
          }
        }
      }
      direction_ = kForward;
    }

    current_->Next();
    FindSmallest();
  }